

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
          (RepeatedPtrField<google::protobuf::Message> *this)

{
  size_t sVar1;
  RepeatedPtrField<google::protobuf::Message> *this_local;
  
  sVar1 = internal::RepeatedPtrFieldBase::
          SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                    (&this->super_RepeatedPtrFieldBase);
  return sVar1;
}

Assistant:

inline size_t RepeatedPtrField<Element>::SpaceUsedExcludingSelfLong() const {
  // `google::protobuf::Message` has a virtual method `SpaceUsedLong`, hence we can
  // instantiate just one function for all protobuf messages.
  // Note: std::is_base_of requires that `Element` is a concrete class.
  using H = typename std::conditional<std::is_base_of<Message, Element>::value,
                                      internal::GenericTypeHandler<Message>,
                                      TypeHandler>::type;
  return RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong<H>();
}